

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rumors.c
# Opt level: O3

void save_oracles(memfile *mf)

{
  ulong uVar1;
  
  mtag(mf,0,MTAG_ORACLES);
  mwrite32(mf,oracle_cnt);
  if (oracle_cnt != 0) {
    uVar1 = 0;
    do {
      mwrite32(mf,oracle_loc[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < oracle_cnt);
  }
  return;
}

Assistant:

void save_oracles(struct memfile *mf)
{
	int i;
	mtag(mf, 0, MTAG_ORACLES);
	mwrite32(mf, oracle_cnt);
	if (oracle_cnt)
	    for (i = 0; i < oracle_cnt; i++)
		mwrite32(mf, oracle_loc[i]);
}